

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

PyObject * pybind11::detail::npy_format_descriptor<sdf_tools::real3,_void>::dtype_ptr(void)

{
  int iVar1;
  numpy_type_info *pnVar2;
  undefined1 in_stack_ffffffffffffffdf;
  numpy_internals *in_stack_ffffffffffffffe0;
  
  if (npy_format_descriptor<sdf_tools::real3,void>::dtype_ptr()::ptr == '\0') {
    iVar1 = __cxa_guard_acquire(&npy_format_descriptor<sdf_tools::real3,void>::dtype_ptr()::ptr);
    if (iVar1 != 0) {
      get_numpy_internals();
      pnVar2 = numpy_internals::get_type_info<sdf_tools::real3>
                         (in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
      dtype_ptr::ptr = pnVar2->dtype_ptr;
      __cxa_guard_release(&npy_format_descriptor<sdf_tools::real3,void>::dtype_ptr()::ptr);
    }
  }
  return dtype_ptr::ptr;
}

Assistant:

static PyObject* dtype_ptr() {
        static PyObject* ptr = get_numpy_internals().get_type_info<T>(true)->dtype_ptr;
        return ptr;
    }